

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O1

void __thiscall FPolyObj::ClosestPoint(FPolyObj *this,DVector2 *fpos,DVector2 *out,side_t **side)

{
  double dVar1;
  double dVar2;
  side_t *psVar3;
  line_t_conflict *plVar4;
  ulong uVar5;
  side_t *psVar6;
  ulong uVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  uVar5 = (ulong)(this->Sidedefs).Count;
  if (uVar5 == 0) {
    psVar6 = (side_t *)0x0;
    dVar9 = 0.0;
    dVar10 = 0.0;
  }
  else {
    dVar11 = INFINITY;
    uVar7 = 0;
    dVar10 = 0.0;
    dVar9 = 0.0;
    psVar6 = (side_t *)0x0;
    do {
      psVar3 = (this->Sidedefs).Array[uVar7];
      plVar4 = psVar3->linedef;
      bVar8 = plVar4->sidedef[0] == psVar3;
      dVar13 = **(double **)(plVar4->args + (ulong)bVar8 * 2 + -0xb);
      dVar15 = (*(double **)(plVar4->args + (ulong)bVar8 * 2 + -0xb))[1];
      dVar1 = **(double **)(plVar4->args + (ulong)!bVar8 * 2 + -0xb);
      dVar2 = (*(double **)(plVar4->args + (ulong)!bVar8 * 2 + -0xb))[1];
      dVar17 = dVar13 - dVar1;
      dVar16 = dVar15 - dVar2;
      dVar18 = dVar16 * dVar16 + dVar17 * dVar17;
      dVar14 = dVar1;
      dVar12 = dVar2;
      if ((((dVar18 != 0.0) || (NAN(dVar18))) &&
          (dVar18 = ((fpos->Y - dVar2) * dVar16 + (fpos->X - dVar1) * dVar17) / dVar18, 0.0 < dVar18
          )) && (dVar14 = dVar13, dVar12 = dVar15, dVar18 < 1.0)) {
        dVar14 = dVar1 + dVar17 * dVar18;
        dVar12 = dVar2 + dVar16 * dVar18;
      }
      dVar15 = dVar14 - fpos->X;
      dVar13 = dVar12 - fpos->Y;
      dVar13 = dVar13 * dVar13 + dVar15 * dVar15;
      if (dVar13 < dVar11) {
        psVar6 = psVar3;
        dVar9 = dVar12;
        dVar10 = dVar14;
        dVar11 = dVar13;
      }
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  out->Y = dVar9;
  out->X = dVar10;
  if (side != (side_t **)0x0) {
    *side = psVar6;
  }
  return;
}

Assistant:

void FPolyObj::ClosestPoint(const DVector2 &fpos, DVector2 &out, side_t **side) const
{
	unsigned int i;
	double x = fpos.X, y = fpos.Y;
	double bestdist = HUGE_VAL;
	double bestx = 0, besty = 0;
	side_t *bestline = NULL;

	for (i = 0; i < Sidedefs.Size(); ++i)
	{
		vertex_t *v1 = Sidedefs[i]->V1();
		vertex_t *v2 = Sidedefs[i]->V2();
		double a = v2->fX() - v1->fX();
		double b = v2->fY() - v1->fY();
		double den = a*a + b*b;
		double ix, iy, dist;

		if (den == 0)
		{ // Line is actually a point!
			ix = v1->fX();
			iy = v1->fY();
		}
		else
		{
			double num = (x - v1->fX()) * a + (y - v1->fY()) * b;
			double u = num / den;
			if (u <= 0)
			{
				ix = v1->fX();
				iy = v1->fY();
			}
			else if (u >= 1)
			{
				ix = v2->fX();
				iy = v2->fY();
			}
			else
			{
				ix = v1->fX() + u * a;
				iy = v1->fY() + u * b;
			}
		}
		a = (ix - x);
		b = (iy - y);
		dist = a*a + b*b;
		if (dist < bestdist)
		{
			bestdist = dist;
			bestx = ix;
			besty = iy;
			bestline = Sidedefs[i];
		}
	}
	out = { bestx, besty };
	if (side != NULL)
	{
		*side = bestline;
	}
}